

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::SizeRange::ByteSizeLong(SizeRange *this)

{
  int iVar1;
  uint64 uVar2;
  int64 iVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  SizeRange *this_local;
  
  sStack_18 = 0;
  uVar2 = lowerbound(this);
  if (uVar2 != 0) {
    uVar2 = lowerbound(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar2);
    sStack_18 = sStack_18 + 1;
  }
  iVar3 = upperbound(this);
  if (iVar3 != 0) {
    iVar3 = upperbound(this);
    sVar4 = google::protobuf::internal::WireFormatLite::Int64Size(iVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t SizeRange::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SizeRange)
  size_t total_size = 0;

  // uint64 lowerBound = 1;
  if (this->lowerbound() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->lowerbound());
  }

  // int64 upperBound = 2;
  if (this->upperbound() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->upperbound());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}